

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O2

void __thiscall
qclab::qgates::QControlledGate2<float>::setControlState
          (QControlledGate2<float> *this,int controlState)

{
  if ((uint)controlState < 2) {
    this->controlState_ = controlState;
    return;
  }
  __assert_fail("( controlState == 0 ) || ( controlState == 1 )",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/include/qclab/qgates/QControlledGate2.hpp"
                ,0x8e,
                "void qclab::qgates::QControlledGate2<float>::setControlState(const int) [T = float]"
               );
}

Assistant:

QControlledGate2( const int control , const int controlState = 1 )
        : control_( control )
        , controlState_( controlState )
        {
          assert( control >= 0 ) ;
          assert( ( controlState == 0 ) || ( controlState == 1 ) ) ;
        }